

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPIllegalAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerComp,
               xmlAttrPtr attr)

{
  xmlChar *str1;
  xmlChar *node;
  xmlParserErrors error_00;
  xmlSchemaParserCtxtPtr actxt;
  xmlChar *str2;
  xmlChar *local_38;
  xmlChar *strB;
  xmlChar *strA;
  xmlAttrPtr attr_local;
  xmlSchemaBasicItemPtr ownerComp_local;
  xmlSchemaParserCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  strB = (xmlChar *)0x0;
  local_38 = (xmlChar *)0x0;
  strA = (xmlChar *)attr;
  attr_local = (xmlAttrPtr)ownerComp;
  ownerComp_local._4_4_ = error;
  pxStack_10 = ctxt;
  xmlSchemaFormatNodeForError(&strB,(xmlSchemaAbstractCtxtPtr)ctxt,attr->parent);
  actxt = pxStack_10;
  error_00 = ownerComp_local._4_4_;
  node = strA;
  str1 = strB;
  str2 = xmlSchemaFormatQNameNs(&local_38,*(xmlNsPtr *)(strA + 0x48),*(xmlChar **)(strA + 0x10));
  xmlSchemaErr4((xmlSchemaAbstractCtxtPtr)actxt,error_00,(xmlNodePtr)node,
                "%sThe attribute \'%s\' is not allowed.\n",str1,str2,(xmlChar *)0x0,(xmlChar *)0x0);
  if (strB != (xmlChar *)0x0) {
    (*xmlFree)(strB);
    strB = (xmlChar *)0x0;
  }
  if (local_38 != (xmlChar *)0x0) {
    (*xmlFree)(local_38);
  }
  return;
}

Assistant:

static void
xmlSchemaPIllegalAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerComp ATTRIBUTE_UNUSED,
			 xmlAttrPtr attr)
{
    xmlChar *strA = NULL, *strB = NULL;

    xmlSchemaFormatNodeForError(&strA, ACTXT_CAST ctxt, attr->parent);
    xmlSchemaErr4(ACTXT_CAST ctxt, error, (xmlNodePtr) attr,
	"%sThe attribute '%s' is not allowed.\n", BAD_CAST strA,
	xmlSchemaFormatQNameNs(&strB, attr->ns, attr->name),
	NULL, NULL);
    FREE_AND_NULL(strA);
    FREE_AND_NULL(strB);
}